

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O1

string * __thiscall
(anonymous_namespace)::ValueToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *value)

{
  size_t sVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (this == (_anonymous_namespace_ *)0x0) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    sVar1 = strlen((char *)this);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,this,this + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ValueToString(const char* const value)
{
  return value ? value : std::string{};
}